

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O2

void __thiscall
TEST_PluginTest_DisablesPluginsDontRun_Test::testBody
          (TEST_PluginTest_DisablesPluginsDontRun_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString SStack_48;
  SimpleString local_38;
  
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  (*pTVar1->_vptr_TestRegistry[0xd])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin);
  (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
    _vptr_TestPlugin[0xc])();
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  pUVar4 = UtestShell::getCurrent();
  iVar2 = (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
            _vptr_TestPlugin[0xe])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK","!thirdPlugin->isEnabled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0xb2,pTVar5);
  (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
    _vptr_TestPlugin[0xd])();
  TestTestingFixture::runAllTests((this->super_TEST_GROUP_CppUTestGroupPluginTest).genFixture);
  iVar2 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin)->super_TestPlugin
                   ).field_0x24;
  pUVar4 = UtestShell::getCurrent();
  if (iVar2 == 2) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb5,pTVar5);
  }
  else {
    StringFrom((int)&local_38);
    pcVar6 = SimpleString::asCharString(&local_38);
    StringFrom((int)&SStack_48);
    pcVar7 = SimpleString::asCharString(&SStack_48);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb5,pTVar5);
    SimpleString::~SimpleString(&SStack_48);
    SimpleString::~SimpleString(&local_38);
  }
  iVar2 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin
                   ).field_0x24;
  pUVar4 = UtestShell::getCurrent();
  if (iVar2 == 1) {
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb6,pTVar5);
  }
  else {
    StringFrom((int)&local_38);
    pcVar6 = SimpleString::asCharString(&local_38);
    StringFrom((int)&SStack_48);
    pcVar7 = SimpleString::asCharString(&SStack_48);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0xb6,pTVar5);
    SimpleString::~SimpleString(&SStack_48);
    SimpleString::~SimpleString(&local_38);
  }
  pUVar4 = UtestShell::getCurrent();
  uVar3 = (*(((this->super_TEST_GROUP_CppUTestGroupPluginTest).thirdPlugin)->super_TestPlugin).
            _vptr_TestPlugin[0xe])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 0xff),"CHECK","thirdPlugin->isEnabled()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0xb7,pTVar5);
  return;
}

Assistant:

TEST(PluginTest, DisablesPluginsDontRun)
{
    registry->installPlugin(thirdPlugin);
    thirdPlugin->disable();
    genFixture->runAllTests();
    CHECK(!thirdPlugin->isEnabled());
    thirdPlugin->enable();
    genFixture->runAllTests();
    CHECK_EQUAL(2, firstPlugin->preAction);
    CHECK_EQUAL(1, thirdPlugin->preAction);
    CHECK(thirdPlugin->isEnabled());
}